

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  long lVar2;
  PCache *pCache;
  sqlite3_file *psVar3;
  sqlite3_io_methods *psVar4;
  u8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  Btree *p;
  BtShared *pBVar12;
  Pager *pPVar13;
  ulong uVar14;
  void *pvVar15;
  sqlite3_mutex *psVar16;
  sqlite3_mutex *psVar17;
  byte bVar18;
  long lVar19;
  ulong uVar20;
  Btree *pBVar21;
  code *pcVar22;
  Btree *pBVar23;
  char *pcVar24;
  Btree *pBVar25;
  Btree *pBVar26;
  Btree **ppBVar27;
  uint uVar28;
  BtShared **ppBVar29;
  u8 uVar30;
  byte bVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  sqlite3_mutex *local_110;
  uint local_104;
  char *local_100;
  char *local_e0;
  char *local_c8;
  uint local_9c;
  uchar zDbHeader [100];
  
  if (zFilename == (char *)0x0) {
LAB_0011c01a:
    bVar33 = true;
    if (db->temp_store != '\x02') goto LAB_0011c031;
LAB_0011c024:
    local_104 = flags | 2;
    bVar18 = 1;
  }
  else {
    cVar1 = *zFilename;
    bVar33 = cVar1 == '\0';
    iVar6 = strcmp(zFilename,":memory:");
    if (iVar6 == 0) goto LAB_0011c024;
    if (cVar1 == '\0') goto LAB_0011c01a;
    bVar33 = false;
LAB_0011c031:
    bVar18 = (byte)((vfsFlags & 0x80U) >> 7);
    local_104 = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar11 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar18 == 0 && !bVar33) {
    uVar11 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar11 = vfsFlags;
  }
  p = (Btree *)sqlite3MallocZero(0x48);
  iVar6 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->inTrans = '\0';
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar33) && ((uVar11 >> 0x11 & 1) != 0 && ((uVar11 & 0x40) == 0 & bVar18) == 0)) {
    iVar10 = sqlite3Strlen30(zFilename);
    uVar28 = iVar10 + 1;
    uVar7 = pVfs->mxPathname + 1;
    uVar32 = uVar28;
    if ((int)uVar28 < (int)uVar7) {
      uVar32 = uVar7;
    }
    pcVar24 = (char *)sqlite3Malloc((ulong)uVar32);
    p->sharable = '\x01';
    if (pcVar24 != (char *)0x0) {
      if (bVar18 == 0) {
        *pcVar24 = '\0';
        iVar6 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar7,pcVar24);
        if (iVar6 != 0) {
          sqlite3_free(pcVar24);
          goto LAB_0011c312;
        }
      }
      else {
        memcpy(pcVar24,zFilename,(ulong)uVar28);
      }
      bVar33 = true;
      if (sqlite3Config.bCoreMutex == 0) {
        psVar16 = (sqlite3_mutex *)0x0;
        bVar34 = true;
        local_110 = (sqlite3_mutex *)0x0;
      }
      else {
        local_110 = (*sqlite3Config.mutex.xMutexAlloc)(4);
        bVar34 = local_110 == (sqlite3_mutex *)0x0;
        if (!bVar34) {
          (*sqlite3Config.mutex.xMutexEnter)(local_110);
        }
        if ((sqlite3Config.bCoreMutex == 0) ||
           (psVar16 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar16 == (sqlite3_mutex *)0x0)) {
          psVar16 = (sqlite3_mutex *)0x0;
        }
        else {
          (*sqlite3Config.mutex.xMutexEnter)(psVar16);
          bVar33 = false;
        }
      }
      ppBVar29 = &sqlite3SharedCacheList;
LAB_0011c67f:
      pBVar12 = *ppBVar29;
      if (pBVar12 != (BtShared *)0x0) {
        pPVar13 = pBVar12->pPager;
        iVar6 = strcmp(pcVar24,pPVar13->zFilename);
        if ((iVar6 != 0) || (pPVar13->pVfs != pVfs)) goto LAB_0011c6a9;
        uVar14 = (ulong)(uint)db->nDb;
        lVar19 = uVar14 * 0x20 + -0x18;
        for (; 0 < (int)uVar14; uVar14 = (ulong)((int)uVar14 - 1)) {
          lVar2 = *(long *)((long)&db->aDb->zName + lVar19);
          if ((lVar2 != 0) && (*(BtShared **)(lVar2 + 8) == pBVar12)) {
            if (!bVar33) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar16);
            }
            if (!bVar34) {
              (*sqlite3Config.mutex.xMutexLeave)(local_110);
            }
            sqlite3_free(pcVar24);
            sqlite3_free(p);
            return 0x13;
          }
          lVar19 = lVar19 + -0x20;
        }
        p->pBt = pBVar12;
        pBVar12->nRef = pBVar12->nRef + 1;
      }
      if (!bVar33) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar16);
      }
      sqlite3_free(pcVar24);
      if (pBVar12 == (BtShared *)0x0) goto LAB_0011c0cb;
      goto LAB_0011c730;
    }
LAB_0011c312:
    sqlite3_free(p);
    return iVar6;
  }
  local_110 = (sqlite3_mutex *)0x0;
LAB_0011c0cb:
  pBVar12 = (BtShared *)sqlite3MallocZero(0x88);
  if (pBVar12 == (BtShared *)0x0) {
    iVar6 = 7;
  }
  else {
    zDbHeader[0] = '\0';
    zDbHeader[1] = '\x04';
    zDbHeader[2] = '\0';
    zDbHeader[3] = '\0';
    uVar32 = 0x30;
    if (0x30 < pVfs->szOsFile) {
      uVar32 = pVfs->szOsFile + 7U & 0xfffffff8;
    }
    pBVar12->pPager = (Pager *)0x0;
    uVar28 = local_104 & 2;
    local_c8 = zFilename;
    if (uVar28 == 0) {
      if (zFilename == (char *)0x0) {
        local_c8 = (char *)0x0;
        bVar33 = true;
LAB_0011c3f7:
        uVar5 = '\0';
        goto LAB_0011c421;
      }
      if (*zFilename == '\0') {
        bVar33 = false;
        goto LAB_0011c3f7;
      }
      iVar6 = pVfs->mxPathname;
      local_100 = (char *)sqlite3Malloc((long)iVar6 * 2 + 2);
      if (local_100 == (char *)0x0) {
LAB_0011c38a:
        iVar6 = 7;
      }
      else {
        *local_100 = '\0';
        iVar6 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar6 + 1,local_100);
        uVar7 = sqlite3Strlen30(local_100);
        uVar8 = sqlite3Strlen30(zFilename);
        local_e0 = zFilename + (ulong)uVar8 + 1;
        for (pcVar24 = local_e0; *pcVar24 != '\0';
            pcVar24 = pcVar24 + (ulong)uVar9 + (ulong)uVar8 + 2) {
          uVar8 = sqlite3Strlen30(pcVar24);
          uVar9 = sqlite3Strlen30(pcVar24 + (ulong)uVar8 + 1);
        }
        if (iVar6 == 0) {
          if ((int)(uVar7 + 8) <= pVfs->mxPathname) {
            iVar6 = ((int)pcVar24 - (int)local_e0) + 1;
            bVar33 = false;
            uVar5 = '\0';
            goto LAB_0011c438;
          }
          sqlite3CantopenError(0xb45b);
          iVar6 = 0xe;
        }
        sqlite3_free(local_100);
      }
    }
    else {
      if (zFilename == (char *)0x0) {
        uVar5 = '\x01';
        local_c8 = (char *)0x0;
        bVar33 = true;
LAB_0011c421:
        local_100 = (char *)0x0;
        uVar7 = 0;
        local_e0 = (char *)0x0;
        iVar6 = 0;
      }
      else {
        if (*zFilename == '\0') {
          uVar5 = '\x01';
          bVar33 = false;
          goto LAB_0011c421;
        }
        iVar6 = 0;
        local_100 = sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
        if (local_100 == (char *)0x0) goto LAB_0011c38a;
        uVar7 = sqlite3Strlen30(local_100);
        bVar33 = true;
        local_c8 = (char *)0x0;
        uVar5 = '\x01';
        local_e0 = (char *)0x0;
      }
LAB_0011c438:
      uVar14 = (ulong)uVar7;
      pPVar13 = (Pager *)sqlite3MallocZero(((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) +
                                           uVar14 * 3 + (long)(int)(uVar32 * 2) + (long)iVar6 +
                                           0x189);
      if (pPVar13 == (Pager *)0x0) {
        sqlite3DbFree((sqlite3 *)0x0,local_100);
        iVar6 = 7;
      }
      else {
        pPVar13->pPCache = (PCache *)(pPVar13 + 1);
        pPVar13->fd = (sqlite3_file *)&pPVar13[1].jfd;
        pcVar24 = pPVar13[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x38);
        pPVar13->sjfd = (sqlite3_file *)pcVar24;
        pPVar13->jfd = (sqlite3_file *)(pcVar24 + (int)uVar32);
        pcVar24 = pcVar24 + (int)uVar32 + (int)uVar32;
        pPVar13->zFilename = pcVar24;
        if (local_100 != (char *)0x0) {
          pPVar13->zJournal = pcVar24 + (int)(iVar6 + uVar7 + 1);
          memcpy(pcVar24,local_100,uVar14);
          if (iVar6 != 0) {
            memcpy(pPVar13->zFilename + (uVar7 + 1),local_e0,(long)iVar6);
          }
          memcpy(pPVar13->zJournal,local_100,uVar14);
          builtin_strncpy(pPVar13->zJournal + uVar14,"-journal",9);
          (pPVar13->zJournal + uVar14 + 8)[1] = '\0';
          pPVar13->zWal = pPVar13->zJournal + uVar14 + 9;
          memcpy(pPVar13->zJournal + uVar14 + 9,local_100,uVar14);
          builtin_strncpy(pPVar13->zWal + uVar14,"-wal",5);
          sqlite3_free(local_100);
        }
        pPVar13->pVfs = pVfs;
        pPVar13->vfsFlags = uVar11;
        if ((bVar33) || (*local_c8 == '\0')) {
LAB_0011c8af:
          pPVar13->eState = '\x01';
          pPVar13->eLock = '\x04';
          pPVar13->noLock = '\x01';
          bVar31 = (byte)uVar11 & 1;
          uVar30 = '\x01';
          bVar33 = false;
LAB_0011c8c6:
          iVar6 = sqlite3PagerSetPagesize(pPVar13,(u32 *)zDbHeader,-1);
          if (iVar6 == 0) {
            pcVar22 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar28 == 0) {
              pcVar22 = pagerStress;
            }
            pCache = pPVar13->pPCache;
            pCache->szPage = 0;
            pCache->szExtra = 0;
            pCache->bPurgeable = '\0';
            pCache->eCreate = '\0';
            *(undefined6 *)&pCache->field_0x2a = 0;
            pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pCache->pStress = (void *)0x0;
            pCache->pSynced = (PgHdr *)0x0;
            pCache->nRef = 0;
            pCache->szCache = 0;
            pCache->pCache = (sqlite3_pcache *)0x0;
            pCache->pPage1 = (PgHdr *)0x0;
            pCache->pDirty = (PgHdr *)0x0;
            pCache->pDirtyTail = (PgHdr *)0x0;
            pCache->szPage = 1;
            pCache->szExtra = 0x78;
            pCache->bPurgeable = (byte)(uVar28 >> 1) ^ 1;
            pCache->eCreate = '\x02';
            pCache->xStress = pcVar22;
            pCache->pStress = pPVar13;
            pCache->szCache = 100;
            iVar6 = sqlite3PcacheSetPageSize(pCache,zDbHeader._0_4_);
            if (iVar6 == 0) {
              pPVar13->useJournal = (byte)(local_104 & 1) ^ 1;
              pPVar13->mxPgno = 0x3fffffff;
              pPVar13->tempFile = uVar30;
              pPVar13->exclusiveMode = uVar30;
              pPVar13->changeCountDone = uVar30;
              pPVar13->memDb = uVar5;
              pPVar13->readOnly = bVar31;
              pPVar13->noSync = uVar30;
              if (bVar33) {
                pPVar13->fullSync = '\x01';
                pPVar13->ckptSyncFlags = '\x02';
                pPVar13->walSyncFlags = '\"';
                pPVar13->syncFlags = '\x02';
              }
              pPVar13->nExtra = 0x78;
              pPVar13->journalSizeLimit = -1;
              setSectorSize(pPVar13);
              if ((local_104 & 3) != 0) {
                pPVar13->journalMode = ((local_104 & 1) == 0) * '\x02' + '\x02';
              }
              pPVar13->xReiniter = pageReinit;
              pBVar12->pPager = pPVar13;
              pPVar13->szMmap = db->szMmap;
              pagerFixMaplimit(pPVar13);
              zDbHeader[0x50] = '\0';
              zDbHeader[0x51] = '\0';
              zDbHeader[0x52] = '\0';
              zDbHeader[0x53] = '\0';
              zDbHeader[0x54] = '\0';
              zDbHeader[0x55] = '\0';
              zDbHeader[0x56] = '\0';
              zDbHeader[0x57] = '\0';
              zDbHeader[0x58] = '\0';
              zDbHeader[0x59] = '\0';
              zDbHeader[0x5a] = '\0';
              zDbHeader[0x5b] = '\0';
              zDbHeader[0x5c] = '\0';
              zDbHeader[0x5d] = '\0';
              zDbHeader[0x5e] = '\0';
              zDbHeader[0x5f] = '\0';
              zDbHeader[0x40] = '\0';
              zDbHeader[0x41] = '\0';
              zDbHeader[0x42] = '\0';
              zDbHeader[0x43] = '\0';
              zDbHeader[0x44] = '\0';
              zDbHeader[0x45] = '\0';
              zDbHeader[0x46] = '\0';
              zDbHeader[0x47] = '\0';
              zDbHeader[0x48] = '\0';
              zDbHeader[0x49] = '\0';
              zDbHeader[0x4a] = '\0';
              zDbHeader[0x4b] = '\0';
              zDbHeader[0x4c] = '\0';
              zDbHeader[0x4d] = '\0';
              zDbHeader[0x4e] = '\0';
              zDbHeader[0x4f] = '\0';
              zDbHeader[0x30] = '\0';
              zDbHeader[0x31] = '\0';
              zDbHeader[0x32] = '\0';
              zDbHeader[0x33] = '\0';
              zDbHeader[0x34] = '\0';
              zDbHeader[0x35] = '\0';
              zDbHeader[0x36] = '\0';
              zDbHeader[0x37] = '\0';
              zDbHeader[0x38] = '\0';
              zDbHeader[0x39] = '\0';
              zDbHeader[0x3a] = '\0';
              zDbHeader[0x3b] = '\0';
              zDbHeader[0x3c] = '\0';
              zDbHeader[0x3d] = '\0';
              zDbHeader[0x3e] = '\0';
              zDbHeader[0x3f] = '\0';
              zDbHeader[0x20] = '\0';
              zDbHeader[0x21] = '\0';
              zDbHeader[0x22] = '\0';
              zDbHeader[0x23] = '\0';
              zDbHeader[0x24] = '\0';
              zDbHeader[0x25] = '\0';
              zDbHeader[0x26] = '\0';
              zDbHeader[0x27] = '\0';
              zDbHeader[0x28] = '\0';
              zDbHeader[0x29] = '\0';
              zDbHeader[0x2a] = '\0';
              zDbHeader[0x2b] = '\0';
              zDbHeader[0x2c] = '\0';
              zDbHeader[0x2d] = '\0';
              zDbHeader[0x2e] = '\0';
              zDbHeader[0x2f] = '\0';
              zDbHeader[0x10] = '\0';
              zDbHeader[0x11] = '\0';
              zDbHeader[0x12] = '\0';
              zDbHeader[0x13] = '\0';
              zDbHeader[0x14] = '\0';
              zDbHeader[0x15] = '\0';
              zDbHeader[0x16] = '\0';
              zDbHeader[0x17] = '\0';
              zDbHeader[0x18] = '\0';
              zDbHeader[0x19] = '\0';
              zDbHeader[0x1a] = '\0';
              zDbHeader[0x1b] = '\0';
              zDbHeader[0x1c] = '\0';
              zDbHeader[0x1d] = '\0';
              zDbHeader[0x1e] = '\0';
              zDbHeader[0x1f] = '\0';
              zDbHeader[0x60] = '\0';
              zDbHeader[0x61] = '\0';
              zDbHeader[0x62] = '\0';
              zDbHeader[99] = '\0';
              zDbHeader[0] = '\0';
              zDbHeader[1] = '\0';
              zDbHeader[2] = '\0';
              zDbHeader[3] = '\0';
              zDbHeader[4] = '\0';
              zDbHeader[5] = '\0';
              zDbHeader[6] = '\0';
              zDbHeader[7] = '\0';
              zDbHeader[8] = '\0';
              zDbHeader[9] = '\0';
              zDbHeader[10] = '\0';
              zDbHeader[0xb] = '\0';
              zDbHeader[0xc] = '\0';
              zDbHeader[0xd] = '\0';
              zDbHeader[0xe] = '\0';
              zDbHeader[0xf] = '\0';
              psVar3 = pBVar12->pPager->fd;
              psVar4 = psVar3->pMethods;
              if (((psVar4 == (sqlite3_io_methods *)0x0) ||
                  (iVar6 = (*psVar4->xRead)(psVar3,zDbHeader,100,0), iVar6 == 0x20a)) ||
                 (iVar6 == 0)) {
                pBVar12->openFlags = (u8)local_104;
                pBVar12->db = db;
                pPVar13 = pBVar12->pPager;
                pPVar13->xBusyHandler = btreeInvokeBusyHandler;
                pPVar13->pBusyHandlerArg = pBVar12;
                psVar4 = pPVar13->fd->pMethods;
                if (psVar4 != (sqlite3_io_methods *)0x0) {
                  (*psVar4->xFileControl)(pPVar13->fd,0xf,&pPVar13->xBusyHandler);
                  pPVar13 = pBVar12->pPager;
                }
                p->pBt = pBVar12;
                pBVar12->pCursor = (BtCursor *)0x0;
                pBVar12->pPage1 = (MemPage *)0x0;
                if (pPVar13->readOnly != '\0') {
                  *(byte *)&pBVar12->btsFlags = (byte)pBVar12->btsFlags | 1;
                }
                iVar6 = (int)((zDbHeader._16_8_ & 0xff) << 8);
                uVar11 = (uint)zDbHeader[0x11] * 0x10000 + iVar6;
                pBVar12->pageSize = uVar11;
                if (((iVar6 + (uint)zDbHeader[0x11] * 0x10000) - 0x10001 < 0xffff01ff) ||
                   ((uVar11 + 0x1ffff & uVar11) != 0)) {
                  pBVar12->pageSize = 0;
                  uVar11 = 0;
                  if (zFilename != (char *)0x0 && bVar18 == 0) {
                    pBVar12->autoVacuum = '\0';
                    pBVar12->incrVacuum = '\0';
                    uVar11 = 0;
                  }
                }
                else {
                  uVar11 = (uint)zDbHeader[0x14];
                  pBVar12->btsFlags = pBVar12->btsFlags | 2;
                  pBVar12->autoVacuum =
                       (((uint)zDbHeader._52_4_ >> 0x18 != 0 ||
                        (zDbHeader._48_8_ & 0xff000000000000) != 0) ||
                       (zDbHeader._48_8_ & 0xff0000000000) != 0) ||
                       (zDbHeader._48_8_ & 0xff00000000) != 0;
                  pBVar12->incrVacuum =
                       (((uint)zDbHeader._64_4_ >> 0x18 != 0 || (zDbHeader._64_8_ & 0xff0000) != 0)
                       || (zDbHeader._64_8_ & 0xff00) != 0) || (zDbHeader._64_8_ & 0xff) != 0;
                }
                iVar6 = sqlite3PagerSetPagesize(pPVar13,&pBVar12->pageSize,uVar11);
                if (iVar6 == 0) {
                  pBVar12->usableSize = pBVar12->pageSize - uVar11;
                  if (p->sharable != '\0') {
                    pBVar12->nRef = 1;
                    if (sqlite3Config.bCoreMutex != 0) {
                      psVar16 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                      if (sqlite3Config.bCoreMutex != 0) {
                        psVar17 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                        pBVar12->mutex = psVar17;
                        if (psVar17 == (sqlite3_mutex *)0x0) {
                          db->mallocFailed = '\0';
                          iVar6 = 7;
                          goto LAB_0011c989;
                        }
                      }
                      if (psVar16 != (sqlite3_mutex *)0x0) {
                        (*sqlite3Config.mutex.xMutexEnter)(psVar16);
                        pBVar12->pNext = sqlite3SharedCacheList;
                        sqlite3SharedCacheList = pBVar12;
                        (*sqlite3Config.mutex.xMutexLeave)(psVar16);
                        goto LAB_0011c730;
                      }
                    }
                    pBVar12->pNext = sqlite3SharedCacheList;
                    sqlite3SharedCacheList = pBVar12;
                  }
LAB_0011c730:
                  if (p->sharable != '\0') {
                    uVar20 = 0;
                    uVar14 = (ulong)(uint)db->nDb;
                    if (db->nDb < 1) {
                      uVar14 = uVar20;
                    }
                    for (; uVar14 * 0x20 != uVar20; uVar20 = uVar20 + 0x20) {
                      pBVar26 = *(Btree **)((long)&db->aDb->pBt + uVar20);
                      if ((pBVar26 != (Btree *)0x0) && (pBVar26->sharable != '\0'))
                      goto LAB_0011c774;
                    }
                  }
                  goto LAB_0011c83e;
                }
              }
              goto LAB_0011c989;
            }
          }
        }
        else {
          local_9c = 0;
          iVar6 = (*pVfs->xOpen)(pVfs,pPVar13->zFilename,pPVar13->fd,uVar11 & 0x87f7f,
                                 (int *)&local_9c);
          if (iVar6 == 0) {
            uVar32 = local_9c & 1;
            bVar31 = (byte)uVar32;
            uVar11 = (*pPVar13->fd->pMethods->xDeviceCharacteristics)(pPVar13->fd);
            if (uVar32 == 0) {
              setSectorSize(pPVar13);
              uVar32 = pPVar13->sectorSize;
              if (0x400 < uVar32) {
                if (uVar32 < 0x2001) {
                  zDbHeader[0] = (char)uVar32;
                  zDbHeader[1] = (char)(uVar32 >> 8);
                  zDbHeader[2] = (char)(uVar32 >> 0x10);
                  zDbHeader[3] = (char)(uVar32 >> 0x18);
                }
                else {
                  zDbHeader[0] = '\0';
                  zDbHeader[1] = ' ';
                  zDbHeader[2] = '\0';
                  zDbHeader[3] = '\0';
                }
              }
            }
            iVar6 = sqlite3_uri_boolean(local_c8,"nolock",0);
            pPVar13->noLock = (u8)iVar6;
            if (((uVar11 >> 0xd & 1) != 0) ||
               (iVar6 = sqlite3_uri_boolean(local_c8,"immutable",0), iVar6 != 0)) {
              uVar11 = 1;
              goto LAB_0011c8af;
            }
            bVar33 = true;
            uVar30 = '\0';
            goto LAB_0011c8c6;
          }
        }
        psVar3 = pPVar13->fd;
        if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar3->pMethods->xClose)(psVar3);
          psVar3->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar13->pTmpSpace);
        sqlite3_free(pPVar13);
      }
    }
LAB_0011c989:
    if (pBVar12->pPager != (Pager *)0x0) {
      sqlite3PagerClose(pBVar12->pPager);
    }
  }
  sqlite3_free(pBVar12);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
LAB_0011c9ab:
  if (local_110 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_110);
  }
  return iVar6;
LAB_0011c6a9:
  ppBVar29 = &pBVar12->pNext;
  goto LAB_0011c67f;
LAB_0011c774:
  do {
    pBVar23 = pBVar26;
    pBVar26 = pBVar23->pPrev;
  } while (pBVar23->pPrev != (Btree *)0x0);
  lVar19 = 0x20;
  if (p->pBt < pBVar23->pBt) {
    ppBVar27 = &pBVar23->pPrev;
    pBVar21 = (Btree *)0x0;
    pBVar26 = p;
  }
  else {
    do {
      pBVar25 = pBVar23;
      pBVar26 = pBVar25->pNext;
      if (pBVar26 == (Btree *)0x0) {
        ppBVar27 = &pBVar25->pNext;
        pBVar23 = (Btree *)0x0;
        pBVar21 = pBVar25;
        pBVar26 = p;
        goto LAB_0011c832;
      }
      pBVar23 = pBVar26;
    } while (pBVar26->pBt < p->pBt);
    ppBVar27 = &pBVar25->pNext;
    p->pNext = pBVar26;
    lVar19 = 0x28;
    pBVar21 = p;
    pBVar23 = pBVar25;
  }
LAB_0011c832:
  *(Btree **)((long)&p->db + lVar19) = pBVar23;
  pBVar26->pPrev = pBVar21;
  *ppBVar27 = p;
LAB_0011c83e:
  *ppBtree = p;
  iVar6 = 0;
  pvVar15 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar15 == (void *)0x0) {
    sqlite3PagerSetCachesize(p->pBt->pPager,2000);
  }
  goto LAB_0011c9ab;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          EXTRA_SIZE, flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      pBt->nRef = 1;
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM;
          db->mallocFailed = 0;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( p->pBt<pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && pSib->pNext->pBt<p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  return rc;
}